

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cecSat.c
# Opt level: O2

int Cec2_ManSweepNode(Cec2_Man_t *p,int iObj)

{
  Gia_Rpr_t *pGVar1;
  long *plVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  Gia_Man_t *pGVar5;
  char cVar6;
  uint uVar7;
  uint uVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  abctime aVar12;
  Gia_Obj_t *pGVar13;
  Gia_Obj_t *pGVar14;
  word *pwVar15;
  abctime aVar16;
  satoko_stats_t *psVar17;
  long lVar18;
  long lVar19;
  
  aVar12 = Abc_Clock();
  pGVar13 = Gia_ManObj(p->pAig,iObj);
  pGVar14 = Gia_ObjReprObj(p->pAig,iObj);
  uVar7 = Abc_LitIsCompl(pGVar13->Value);
  uVar8 = Abc_LitIsCompl(pGVar14->Value);
  uVar7 = ((uint)((ulong)*(undefined8 *)pGVar14 >> 0x20) ^
          (uint)((ulong)*(undefined8 *)pGVar13 >> 0x20)) >> 0x1f ^ uVar8 ^ uVar7;
  iVar9 = Abc_Lit2Var(pGVar14->Value);
  iVar10 = Abc_Lit2Var(pGVar13->Value);
  iVar9 = Cec2_ManSolveTwo(p,iVar9,iVar10,uVar7);
  if (iVar9 == -1) {
    p->nSatUnsat = p->nSatUnsat + 1;
    uVar7 = Abc_LitNotCond(pGVar14->Value,uVar7);
    pGVar13->Value = uVar7;
    iVar9 = 1;
    lVar19 = 0x70;
    uVar7 = 0x10000000;
  }
  else {
    if (iVar9 == 1) {
      uVar3 = p->nPatterns;
      uVar4 = p->nSatSat;
      p->nPatterns = uVar3 + 1;
      p->nSatSat = uVar4 + 1;
      pGVar5 = p->pAig;
      iVar11 = pGVar5->nSimWords * 0x40;
      iVar9 = pGVar5->iPatsPi + 1;
      iVar10 = 1;
      if (pGVar5->iPatsPi == iVar11 + -1) {
        iVar9 = 1;
      }
      pGVar5->iPatsPi = iVar9;
      if ((iVar9 < 1) || (iVar11 <= iVar9)) {
        __assert_fail("p->pAig->iPatsPi > 0 && p->pAig->iPatsPi < 64 * p->pAig->nSimWords",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/cec/cecSat.c"
                      ,0x36d,"int Cec2_ManSweepNode(Cec2_Man_t *, int)");
      }
      lVar19 = 0x68;
      while( true ) {
        if (p->vObjSatPairs->nSize <= iVar10) break;
        iVar9 = Vec_IntEntry(p->vObjSatPairs,iVar10 + -1);
        uVar7 = Vec_IntEntry(p->vObjSatPairs,iVar10);
        pGVar5 = p->pAig;
        cVar6 = satoko_var_polarity(p->pSat,uVar7);
        pwVar15 = Cec2_ObjSim(pGVar5,iVar9);
        uVar7 = pGVar5->iPatsPi;
        lVar18 = (long)((int)uVar7 >> 5);
        uVar8 = *(uint *)((long)pwVar15 + lVar18 * 4);
        uVar7 = uVar7 & 0x1f;
        if (((cVar6 != '\0' ^ (byte)(uVar8 >> (sbyte)uVar7)) & 1) == 0) {
          *(uint *)((long)pwVar15 + lVar18 * 4) = uVar8 ^ 1 << uVar7;
        }
        iVar10 = iVar10 + 2;
      }
      iVar9 = 0;
      goto LAB_005204fe;
    }
    p->nSatUndec = p->nSatUndec + 1;
    if (iVar9 != 0) {
      __assert_fail("status == SATOKO_UNDEC",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/cec/cecSat.c"
                    ,0x37e,"int Cec2_ManSweepNode(Cec2_Man_t *, int)");
    }
    iVar9 = 2;
    lVar19 = 0x78;
    uVar7 = 0x20000000;
  }
  pGVar1 = p->pAig->pReprs + iObj;
  *pGVar1 = (Gia_Rpr_t)((uint)*pGVar1 | uVar7);
LAB_005204fe:
  aVar16 = Abc_Clock();
  plVar2 = (long *)((long)&p->pPars + lVar19);
  *plVar2 = *plVar2 + (aVar16 - aVar12);
  if (p->pPars->fUseCones == 0) {
    aVar12 = Abc_Clock();
    satoko_rollback(p->pSat);
    aVar16 = Abc_Clock();
    p->timeExtra = p->timeExtra + (aVar16 - aVar12);
    psVar17 = satoko_stats(p->pSat);
    psVar17->n_conflicts = 0;
  }
  return iVar9;
}

Assistant:

int Cec2_ManSweepNode( Cec2_Man_t * p, int iObj )
{
    abctime clk = Abc_Clock();
    int i, IdAig, IdSat, status, RetValue = 1;
    Gia_Obj_t * pObj = Gia_ManObj( p->pAig, iObj );
    Gia_Obj_t * pRepr = Gia_ObjReprObj( p->pAig, iObj );
    int fCompl = Abc_LitIsCompl(pObj->Value) ^ Abc_LitIsCompl(pRepr->Value) ^ pObj->fPhase ^ pRepr->fPhase;
    status = Cec2_ManSolveTwo( p, Abc_Lit2Var(pRepr->Value), Abc_Lit2Var(pObj->Value), fCompl );
    if ( status == SATOKO_SAT )
    {
        p->nSatSat++;
        p->nPatterns++;
        p->pAig->iPatsPi = (p->pAig->iPatsPi == 64 * p->pAig->nSimWords - 1) ? 1 : p->pAig->iPatsPi + 1;
        assert( p->pAig->iPatsPi > 0 && p->pAig->iPatsPi < 64 * p->pAig->nSimWords );
        Vec_IntForEachEntryDouble( p->vObjSatPairs, IdAig, IdSat, i )
            Cec2_ObjSimSetInputBit( p->pAig, IdAig, satoko_var_polarity(p->pSat, IdSat) == SATOKO_LIT_TRUE );
        p->timeSatSat += Abc_Clock() - clk;
        RetValue = 0;
    }
    else if ( status == SATOKO_UNSAT )
    {
        p->nSatUnsat++;
        pObj->Value = Abc_LitNotCond( pRepr->Value, fCompl );
        Gia_ObjSetProved( p->pAig, iObj );
        p->timeSatUnsat += Abc_Clock() - clk;
        RetValue = 1;
    }
    else 
    {
        p->nSatUndec++;
        assert( status == SATOKO_UNDEC );
        Gia_ObjSetFailed( p->pAig, iObj );
        p->timeSatUndec += Abc_Clock() - clk;
        RetValue = 2;
    }
    if ( p->pPars->fUseCones )
        return RetValue;
    clk = Abc_Clock();
    satoko_rollback( p->pSat );
    p->timeExtra += Abc_Clock() - clk;
    satoko_stats(p->pSat)->n_conflicts = 0;
    return RetValue;
}